

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

nhdp_domain *
nhdp_domain_configure(uint8_t ext,char *metric_name,char *mpr_name,uint8_t willingness)

{
  int *piVar1;
  int iVar2;
  nhdp_domain *domain;
  long lVar3;
  nhdp_domain_metric *pnVar4;
  
  domain = nhdp_domain_add(ext);
  if (domain != (nhdp_domain *)0x0) {
    if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
      oonf_log(1,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x486,0,0,
               "Configure domain %u to metric=%s",domain->index,metric_name);
    }
    iVar2 = strcasecmp(domain->metric_name,metric_name);
    if (iVar2 != 0) {
      if (domain->metric != &_no_metric) {
        _remove_metric(domain);
      }
      iVar2 = strcasecmp(metric_name,"*");
      if ((iVar2 == 0) && (_domain_metrics.count != 0)) {
        metric_name = (char *)_domain_metrics.list_head.next[-8].next;
      }
      lVar3 = avl_find(&_domain_metrics,metric_name);
      pnVar4 = (nhdp_domain_metric *)(lVar3 + -0x80);
      if (lVar3 == 0) {
        pnVar4 = &_no_metric;
      }
      strscpy(domain,pnVar4->name,0x10);
      piVar1 = &domain->metric->_refcount;
      *piVar1 = *piVar1 + -1;
      domain->metric = pnVar4;
      iVar2 = pnVar4->_refcount;
      if (iVar2 == 0) {
        if (pnVar4->enable == (_func_void *)0x0) {
          iVar2 = 0;
        }
        else {
          (*pnVar4->enable)();
          iVar2 = pnVar4->_refcount;
        }
      }
      pnVar4->_refcount = iVar2 + 1;
    }
    if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
      oonf_log(1,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_domain.c",0x489,0,0,
               "Configure domain %u to mpr=%s, willingness=%u",domain->index,mpr_name,willingness);
    }
    _apply_mpr(domain,mpr_name,willingness);
    oonf_class_event(&_domain_class,domain,OONF_OBJECT_CHANGED);
  }
  return domain;
}

Assistant:

struct nhdp_domain *
nhdp_domain_configure(uint8_t ext, const char *metric_name, const char *mpr_name, uint8_t willingness) {
  struct nhdp_domain *domain;

  domain = nhdp_domain_add(ext);
  if (domain == NULL) {
    return NULL;
  }

  OONF_DEBUG(LOG_NHDP, "Configure domain %u to metric=%s", domain->index, metric_name);
  _apply_metric(domain, metric_name);

  OONF_DEBUG(LOG_NHDP, "Configure domain %u to mpr=%s, willingness=%u", domain->index, mpr_name, willingness);
  _apply_mpr(domain, mpr_name, willingness);

  oonf_class_event(&_domain_class, domain, OONF_OBJECT_CHANGED);

  return domain;
}